

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O0

void av1_init_mb_wiener_var_buffer(AV1_COMP *cpi)

{
  long lVar1;
  size_t size;
  void *pvVar2;
  size_t in_RDI;
  AV1_COMMON *cm;
  
  size = in_RDI + 0x3bf80;
  *(undefined1 *)(in_RDI + 0x9d5f8) = 3;
  if (*(int *)(in_RDI + 0x42780) == 0) {
    lVar1 = *(long *)(in_RDI + 0x9d5d8);
  }
  else {
    if ((*(long *)(in_RDI + 0x9d5d8) == 0) || (*(long *)(in_RDI + 0x9d5e0) == 0)) goto LAB_01233fdf;
    lVar1 = *(long *)(in_RDI + 0x9d5e8);
  }
  if (lVar1 != 0) {
    return;
  }
LAB_01233fdf:
  pvVar2 = aom_calloc(in_RDI,size);
  *(void **)(in_RDI + 0x9d5d8) = pvVar2;
  if (*(long *)(in_RDI + 0x9d5d8) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(size + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate cpi->mb_weber_stats");
  }
  if (*(int *)(in_RDI + 0x42780) != 0) {
    pvVar2 = aom_calloc(in_RDI,size);
    *(void **)(in_RDI + 0x9d5e0) = pvVar2;
    if (*(long *)(in_RDI + 0x9d5e0) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(size + 0x30),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate cpi->prep_rate_estimates");
    }
    pvVar2 = aom_calloc(in_RDI,size);
    *(void **)(in_RDI + 0x9d5e8) = pvVar2;
    if (*(long *)(in_RDI + 0x9d5e8) == 0) {
      aom_internal_error(*(aom_internal_error_info **)(size + 0x30),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate cpi->ext_rate_distribution");
    }
  }
  return;
}

Assistant:

void av1_init_mb_wiener_var_buffer(AV1_COMP *cpi) {
  AV1_COMMON *cm = &cpi->common;

  // This block size is also used to determine number of workers in
  // multi-threading. If it is changed, one needs to change it accordingly in
  // "compute_num_ai_workers()".
  cpi->weber_bsize = BLOCK_8X8;

  if (cpi->oxcf.enable_rate_guide_deltaq) {
    if (cpi->mb_weber_stats && cpi->prep_rate_estimates &&
        cpi->ext_rate_distribution)
      return;
  } else {
    if (cpi->mb_weber_stats) return;
  }

  CHECK_MEM_ERROR(cm, cpi->mb_weber_stats,
                  aom_calloc(cpi->frame_info.mi_rows * cpi->frame_info.mi_cols,
                             sizeof(*cpi->mb_weber_stats)));

  if (cpi->oxcf.enable_rate_guide_deltaq) {
    CHECK_MEM_ERROR(
        cm, cpi->prep_rate_estimates,
        aom_calloc(cpi->frame_info.mi_rows * cpi->frame_info.mi_cols,
                   sizeof(*cpi->prep_rate_estimates)));

    CHECK_MEM_ERROR(
        cm, cpi->ext_rate_distribution,
        aom_calloc(cpi->frame_info.mi_rows * cpi->frame_info.mi_cols,
                   sizeof(*cpi->ext_rate_distribution)));
  }
}